

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_getupvalue(lua_State *L,int funcindex,int n)

{
  StkId pSVar1;
  TValue *fi;
  char *pcVar2;
  TValue *io2;
  TValue *io1;
  TValue *val;
  char *name;
  int n_local;
  int funcindex_local;
  lua_State *L_local;
  
  io1 = (TValue *)0x0;
  name._0_4_ = n;
  name._4_4_ = funcindex;
  _n_local = L;
  fi = index2value(L,funcindex);
  pcVar2 = aux_upvalue(fi,(int)name,&io1,(GCObject **)0x0);
  if (pcVar2 != (char *)0x0) {
    pSVar1 = (_n_local->top).p;
    (pSVar1->val).value_ = io1->value_;
    (pSVar1->val).tt_ = io1->tt_;
    (_n_local->top).p = (StkId)((_n_local->top).offset + 0x10);
  }
  return pcVar2;
}

Assistant:

LUA_API const char *lua_getupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  lua_lock(L);
  name = aux_upvalue(index2value(L, funcindex), n, &val, NULL);
  if (name) {
    setobj2s(L, L->top.p, val);
    api_incr_top(L);
  }
  lua_unlock(L);
  return name;
}